

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> * __thiscall
deqp::ShaderLibrary::loadShaderFile
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          ShaderLibrary *this,char *fileName)

{
  Archive *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<char,_std::allocator<char>_> buf;
  _Vector_base<char,_std::allocator<char>_> local_a8;
  ShaderParser local_88;
  long *plVar3;
  
  pAVar1 = this->m_testCtx->m_curArchive;
  iVar2 = (*pAVar1->_vptr_Archive[2])(pAVar1,fileName);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  local_a8._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (**(code **)(*plVar3 + 0x18))(plVar3);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&local_a8,(long)(iVar2 + 1));
  (**(code **)(*plVar3 + 0x10))(plVar3,local_a8._M_impl.super__Vector_impl_data._M_start,iVar2);
  local_a8._M_impl.super__Vector_impl_data._M_start[iVar2] = '\0';
  (**(code **)(*plVar3 + 8))(plVar3);
  local_88.m_testCtx = this->m_testCtx;
  local_88.m_renderCtx = this->m_renderCtx;
  local_88.m_input._M_dataplus._M_p = (pointer)&local_88.m_input.field_2;
  local_88.m_input._M_string_length = 0;
  local_88.m_input.field_2._M_local_buf[0] = '\0';
  local_88.m_curPtr = (char *)0x0;
  local_88.m_curToken = TOKEN_LAST;
  local_88.m_curTokenStr._M_dataplus._M_p = (pointer)&local_88.m_curTokenStr.field_2;
  local_88.m_curTokenStr._M_string_length = 0;
  local_88.m_curTokenStr.field_2._M_local_buf[0] = '\0';
  sl::ShaderParser::parse
            (__return_storage_ptr__,&local_88,local_a8._M_impl.super__Vector_impl_data._M_start);
  sl::ShaderParser::~ShaderParser(&local_88);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::TestNode*> ShaderLibrary::loadShaderFile(const char* fileName)
{
	tcu::Resource*	resource = m_testCtx.getArchive().getResource(fileName);
	std::vector<char> buf;

	/*  printf("  loading '%s'\n", fileName);*/

	try
	{
		int size = resource->getSize();
		buf.resize(size + 1);
		resource->read((deUint8*)&buf[0], size);
		buf[size] = '\0';
	}
	catch (const std::exception&)
	{
		delete resource;
		throw;
	}

	delete resource;

	sl::ShaderParser	   parser(m_testCtx, m_renderCtx);
	vector<tcu::TestNode*> nodes = parser.parse(&buf[0]);

	return nodes;
}